

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_encoder_settings_init(LodePNGEncoderSettings *settings)

{
  (settings->zlibsettings).btype = 2;
  (settings->zlibsettings).use_lz77 = 1;
  (settings->zlibsettings).windowsize = 0x800;
  (settings->zlibsettings).minmatch = 3;
  (settings->zlibsettings).nicematch = 0x80;
  (settings->zlibsettings).lazymatching = 1;
  (settings->zlibsettings).custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  (settings->zlibsettings).custom_deflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  (settings->zlibsettings).custom_context = (void *)0x0;
  settings->filter_strategy = LFS_MINSUM;
  settings->auto_convert = 1;
  settings->filter_palette_zero = 1;
  settings->predefined_filters = (uchar *)0x0;
  settings->force_palette = 0;
  settings->add_id = 0;
  settings->text_compression = 1;
  return;
}

Assistant:

void lodepng_compress_settings_init(LodePNGCompressSettings* settings) {
  /*compress with dynamic huffman tree (not in the mathematical sense, just not the predefined one)*/
  settings->btype = 2;
  settings->use_lz77 = 1;
  settings->windowsize = DEFAULT_WINDOWSIZE;
  settings->minmatch = 3;
  settings->nicematch = 128;
  settings->lazymatching = 1;

  settings->custom_zlib = 0;
  settings->custom_deflate = 0;
  settings->custom_context = 0;
}